

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

long __thiscall
mkvparser::ContentEncoding::ParseContentEncodingEntry
          (ContentEncoding *this,longlong start,longlong size,IMkvReader *pReader)

{
  bool bVar1;
  long lVar2;
  ContentCompression **ppCVar3;
  ContentEncryption **ppCVar4;
  ContentEncryption *encryption;
  unsigned_long_long uVar5;
  ContentEncoding *pCVar6;
  long unaff_R12;
  long stop;
  longlong size_1;
  longlong pos;
  longlong id;
  long local_70;
  long local_68;
  uint local_5c;
  IMkvReader *local_58;
  uint local_4c;
  ContentEncoding *local_48;
  long local_40;
  longlong local_38;
  
  local_58 = pReader;
  local_48 = this;
  if (pReader == (IMkvReader *)0x0) {
    __assert_fail("pReader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x106b,
                  "long mkvparser::ContentEncoding::ParseContentEncodingEntry(long long, long long, IMkvReader *)"
                 );
  }
  stop = size + start;
  local_5c = 0;
  local_4c = 0;
  local_68 = start;
  local_38 = start;
  while (pCVar6 = local_48, local_68 < stop) {
    lVar2 = ParseElementHeader(local_58,&local_68,stop,&local_40,&local_70);
    if (lVar2 < 0) {
      bVar1 = false;
      unaff_R12 = lVar2;
    }
    else {
      local_4c = local_4c + (local_40 == 0x5034);
      local_5c = local_5c + (local_40 == 0x5035);
      local_68 = local_68 + local_70;
      bVar1 = local_68 <= stop;
      if (stop < local_68) {
        unaff_R12 = -2;
      }
    }
    if (!bVar1) {
      return unaff_R12;
    }
  }
  if (((int)local_4c < 1) && ((int)local_5c < 1)) {
    return -1;
  }
  if (0 < (int)local_4c) {
    ppCVar3 = (ContentCompression **)operator_new__((ulong)local_4c << 3,(nothrow_t *)&std::nothrow)
    ;
    pCVar6->compression_entries_ = ppCVar3;
    if (ppCVar3 == (ContentCompression **)0x0) {
      return -1;
    }
    pCVar6->compression_entries_end_ = ppCVar3;
  }
  if (0 < (int)local_5c) {
    ppCVar4 = (ContentEncryption **)operator_new__((ulong)local_5c << 3,(nothrow_t *)&std::nothrow);
    pCVar6->encryption_entries_ = ppCVar4;
    if (ppCVar4 == (ContentEncryption **)0x0) {
      if (pCVar6->compression_entries_ != (ContentCompression **)0x0) {
        operator_delete__(pCVar6->compression_entries_);
      }
      pCVar6->compression_entries_ = (ContentCompression **)0x0;
      return -1;
    }
    pCVar6->encryption_entries_end_ = ppCVar4;
  }
  local_68 = local_38;
  do {
    if (stop <= local_68) {
      return (ulong)(local_68 == stop) * 2 + -2;
    }
    lVar2 = ParseElementHeader(local_58,&local_68,stop,&local_40,&local_70);
    if (lVar2 < 0) {
      bVar1 = false;
      goto LAB_001296e6;
    }
    lVar2 = unaff_R12;
    switch(local_40) {
    case 0x5031:
      uVar5 = UnserializeUInt(local_58,local_68,local_70);
      local_48->encoding_order_ = uVar5;
      break;
    case 0x5032:
      uVar5 = UnserializeUInt(local_58,local_68,local_70);
      local_48->encoding_scope_ = uVar5;
      if (uVar5 != 0) break;
      lVar2 = -1;
      goto LAB_001296e4;
    case 0x5033:
      uVar5 = UnserializeUInt(local_58,local_68,local_70);
      local_48->encoding_type_ = uVar5;
      break;
    case 0x5034:
      pCVar6 = (ContentEncoding *)0x18;
      encryption = (ContentEncryption *)operator_new(0x18,(nothrow_t *)&std::nothrow);
      if (encryption == (ContentEncryption *)0x0) {
        encryption = (ContentEncryption *)0x0;
      }
      else {
        encryption->algo = 0;
        encryption->key_id = (uchar *)0x0;
        encryption->key_id_len = 0;
      }
      if (encryption == (ContentEncryption *)0x0) {
LAB_00129686:
        bVar1 = false;
        lVar2 = -1;
      }
      else {
        lVar2 = ParseCompressionEntry
                          (pCVar6,local_68,local_70,local_58,(ContentCompression *)encryption);
        if (lVar2 == 0) {
          if ((int)local_4c < 1) {
            __assert_fail("compression_count > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                          ,0x10b5,
                          "long mkvparser::ContentEncoding::ParseContentEncodingEntry(long long, long long, IMkvReader *)"
                         );
          }
          ppCVar3 = local_48->compression_entries_end_;
          local_48->compression_entries_end_ = ppCVar3 + 1;
          *ppCVar3 = (ContentCompression *)encryption;
          bVar1 = true;
          lVar2 = unaff_R12;
        }
        else {
          if (encryption->key_id != (uchar *)0x0) {
            operator_delete__(encryption->key_id);
          }
LAB_00129677:
          operator_delete(encryption);
          bVar1 = false;
        }
      }
      goto LAB_001296b7;
    case 0x5035:
      pCVar6 = (ContentEncoding *)0x50;
      encryption = (ContentEncryption *)operator_new(0x50,(nothrow_t *)&std::nothrow);
      if (encryption == (ContentEncryption *)0x0) {
        encryption = (ContentEncryption *)0x0;
      }
      else {
        encryption->sig_key_id_len = 0;
        encryption->sig_algo = 0;
        encryption->signature_len = 0;
        encryption->sig_key_id = (uchar *)0x0;
        encryption->key_id_len = 0;
        encryption->signature = (uchar *)0x0;
        encryption->algo = 0;
        encryption->key_id = (uchar *)0x0;
        encryption->sig_hash_algo = 0;
        (encryption->aes_settings).cipher_mode = 1;
      }
      if (encryption == (ContentEncryption *)0x0) goto LAB_00129686;
      lVar2 = ParseEncryptionEntry(pCVar6,local_68,local_70,local_58,encryption);
      if (lVar2 != 0) {
        ContentEncryption::~ContentEncryption(encryption);
        goto LAB_00129677;
      }
      if ((int)local_5c < 1) {
        __assert_fail("encryption_count > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x10c2,
                      "long mkvparser::ContentEncoding::ParseContentEncodingEntry(long long, long long, IMkvReader *)"
                     );
      }
      ppCVar4 = local_48->encryption_entries_end_;
      local_48->encryption_entries_end_ = ppCVar4 + 1;
      *ppCVar4 = encryption;
      bVar1 = true;
      lVar2 = unaff_R12;
LAB_001296b7:
      if (bVar1) break;
LAB_001296e4:
      bVar1 = false;
      goto LAB_001296e6;
    }
    local_68 = local_68 + local_70;
    bVar1 = local_68 <= stop;
    if (stop < local_68) {
      lVar2 = -2;
    }
LAB_001296e6:
    unaff_R12 = lVar2;
    if (!bVar1) {
      return lVar2;
    }
  } while( true );
}

Assistant:

long ContentEncoding::ParseContentEncodingEntry(long long start, long long size,
                                                IMkvReader* pReader) {
  assert(pReader);

  long long pos = start;
  const long long stop = start + size;

  // Count ContentCompression and ContentEncryption elements.
  int compression_count = 0;
  int encryption_count = 0;

  while (pos < stop) {
    long long id, size;
    const long status = ParseElementHeader(pReader, pos, stop, id, size);
    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvContentCompression)
      ++compression_count;

    if (id == libwebm::kMkvContentEncryption)
      ++encryption_count;

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (compression_count <= 0 && encryption_count <= 0)
    return -1;

  if (compression_count > 0) {
    compression_entries_ =
        new (std::nothrow) ContentCompression*[compression_count];
    if (!compression_entries_)
      return -1;
    compression_entries_end_ = compression_entries_;
  }

  if (encryption_count > 0) {
    encryption_entries_ =
        new (std::nothrow) ContentEncryption*[encryption_count];
    if (!encryption_entries_) {
      delete[] compression_entries_;
      compression_entries_ = NULL;
      return -1;
    }
    encryption_entries_end_ = encryption_entries_;
  }

  pos = start;
  while (pos < stop) {
    long long id, size;
    long status = ParseElementHeader(pReader, pos, stop, id, size);
    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvContentEncodingOrder) {
      encoding_order_ = UnserializeUInt(pReader, pos, size);
    } else if (id == libwebm::kMkvContentEncodingScope) {
      encoding_scope_ = UnserializeUInt(pReader, pos, size);
      if (encoding_scope_ < 1)
        return -1;
    } else if (id == libwebm::kMkvContentEncodingType) {
      encoding_type_ = UnserializeUInt(pReader, pos, size);
    } else if (id == libwebm::kMkvContentCompression) {
      ContentCompression* const compression =
          new (std::nothrow) ContentCompression();
      if (!compression)
        return -1;

      status = ParseCompressionEntry(pos, size, pReader, compression);
      if (status) {
        delete compression;
        return status;
      }
      assert(compression_count > 0);
      *compression_entries_end_++ = compression;
    } else if (id == libwebm::kMkvContentEncryption) {
      ContentEncryption* const encryption =
          new (std::nothrow) ContentEncryption();
      if (!encryption)
        return -1;

      status = ParseEncryptionEntry(pos, size, pReader, encryption);
      if (status) {
        delete encryption;
        return status;
      }
      assert(encryption_count > 0);
      *encryption_entries_end_++ = encryption;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;
  return 0;
}